

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decahedron.cpp
# Opt level: O2

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Decahedron::truncatedRing
          (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
           *__return_storage_ptr__,Decahedron *this,int n,int k)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int j;
  int iVar5;
  Vector3d b2;
  Vector3d b1;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = n;
  if (n < 1) {
    iVar4 = 0;
  }
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  while (uVar2 != 5) {
    Vector<double,_3U>::Vector
              (&local_48,
               &(this->Basis).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar2].super_Vector<double,_3U>);
    uVar1 = uVar2 + 1;
    uVar3 = 0;
    if (uVar2 != 4) {
      uVar3 = uVar1 & 0xffffffff;
    }
    Vector<double,_3U>::Vector
              (&local_c0,
               &(this->Basis).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].super_Vector<double,_3U>);
    iVar5 = k;
    uVar2 = uVar1;
    if (k == 0) {
      for (iVar5 = 0; iVar4 != iVar5; iVar5 = iVar5 + 1) {
        operator*(&local_d8,(double)n,&local_48);
        operator-(&local_a8,&local_c0,&local_48);
        operator*(&local_90,(double)iVar5,&local_a8);
        operator+(&local_78,&local_d8,&local_90);
        Vector<double,_3U>::Vector(&local_60,&local_78);
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   __return_storage_ptr__,(Vector3<double> *)&local_60);
      }
    }
    else {
      for (; iVar5 <= n - k; iVar5 = iVar5 + 1) {
        operator*(&local_d8,(double)n,&local_48);
        operator-(&local_a8,&local_c0,&local_48);
        operator*(&local_90,(double)iVar5,&local_a8);
        operator+(&local_78,&local_d8,&local_90);
        Vector<double,_3U>::Vector(&local_60,&local_78);
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   __return_storage_ptr__,(Vector3<double> *)&local_60);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Vector3d> Decahedron::truncatedRing(int n, int k) {
    // This function generates the rings of a Decahedron
    // n: index of shell (order of ring)
    // k: how many atoms are missing from both ends of one side of
    //    pentagon ring

    vector<Vector3d> ring;

    // Generate atomic coordinates along each side of pentagonal ring
    for (int i = 0; i < 5; i++) {
      Vector3d b1 = Basis[i];
      Vector3d b2 = Basis[(i + 1) % 5];

      if (k == 0) {
        // without truncation
        for (int j = 0; j < n; j++) {
          ring.push_back(RealType(n) * b1 + RealType(j) * (b2 - b1));
        }

      } else {
        for (int j = k; j <= n - k; j++) {
          // with truncation
          ring.push_back(RealType(n) * b1 + RealType(j) * (b2 - b1));
        }
      }
    }
    return ring;
  }